

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

void __thiscall
mjs::string_object::string_object
          (string_object *this,string *class_name,object_ptr *prototype,string *val,
          bool is_v5_or_later)

{
  property_attribute pVar1;
  gc_heap_ptr<mjs::gc_string> *p;
  bool is_v5_or_later_local;
  string *val_local;
  object_ptr *prototype_local;
  string *class_name_local;
  string_object *this_local;
  
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_003065d0;
  p = string::unsafe_raw_get(val);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&(this->super_native_object).field_0x24,
             p);
  this->is_v5_or_later_ = is_v5_or_later;
  pVar1 = operator|(dont_enum,dont_delete);
  pVar1 = operator|(pVar1,read_only);
  native_object::add_native_property<mjs::string_object,_&mjs::string_object::get_length,_nullptr>
            (&this->super_native_object,"length",pVar1);
  return;
}

Assistant:

explicit string_object(const string& class_name, const object_ptr& prototype, const string& val, bool is_v5_or_later)
        : native_object{class_name, prototype}
        , value_{val.unsafe_raw_get()}
        , is_v5_or_later_{is_v5_or_later} {
        DEFINE_NATIVE_PROPERTY_READONLY(string_object, length);
    }